

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<QString> * __thiscall
QHash<long_long,_QList<QString>_>::value
          (QList<QString> *__return_storage_ptr__,QHash<long_long,_QList<QString>_> *this,
          longlong *key)

{
  QArrayDataPointer<QString> *other;
  
  other = &valueImpl<long_long>(this,key)->d;
  if (other == (QArrayDataPointer<QString> *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<QString>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }